

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

Value * __thiscall Kvm::evalDefinition(Kvm *this,Value *v,Value *env)

{
  pointer *ppppVVar1;
  Value *pVVar2;
  Value *result;
  Value *local_20;
  
  local_20 = (Value *)0x0;
  Kgc::pushLocalStackRoot(&this->gc_,&local_20);
  local_20 = definitionValue(this,v);
  local_20 = eval(this,local_20,env);
  if (local_20 == (Value *)0x0) {
    pVVar2 = (Value *)0x0;
  }
  else {
    pVVar2 = *(Value **)(*(long *)&v[1].type_ + 0x18);
    if ((((ulong)pVVar2 & 3) != 0) || (pVVar2->type_ != SYMBOL)) {
      pVVar2 = (Value *)pVVar2[1]._vptr_Value;
    }
    defineVariable(this,pVVar2,local_20,env);
    pVVar2 = this->OK;
  }
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -1;
  return pVVar2;
}

Assistant:

const Value* Kvm::evalDefinition(const Value *v, const Value *env)
{
    const Value *result = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result);
    result = definitionValue(v);
    result = eval(result, env);
    if (!result) return nullptr;
    defineVariable(definitionVariable(v), result, env);
    return OK;
}